

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  Primitive *prim;
  bool bVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  float fVar24;
  float fVar27;
  float fVar28;
  undefined1 auVar25 [16];
  float fVar29;
  undefined1 auVar26 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  ulong *local_1300;
  Ray *local_12f8;
  RayQueryContext *local_12f0;
  Primitive *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_1300 = local_11d8 + 1;
      auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar3 = (ray->dir).field_0;
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx((undefined1  [16])aVar3,auVar25);
      auVar30._8_4_ = 0x219392ef;
      auVar30._0_8_ = 0x219392ef219392ef;
      auVar30._12_4_ = 0x219392ef;
      auVar25 = vcmpps_avx(auVar25,auVar30,1);
      auVar25 = vblendvps_avx((undefined1  [16])aVar3,auVar30,auVar25);
      auVar30 = vrcpps_avx(auVar25);
      fVar24 = auVar30._0_4_;
      auVar21._0_4_ = fVar24 * auVar25._0_4_;
      fVar27 = auVar30._4_4_;
      auVar21._4_4_ = fVar27 * auVar25._4_4_;
      fVar28 = auVar30._8_4_;
      auVar21._8_4_ = fVar28 * auVar25._8_4_;
      fVar29 = auVar30._12_4_;
      auVar21._12_4_ = fVar29 * auVar25._12_4_;
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar25 = vsubps_avx(auVar31,auVar21);
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_1238._4_4_ = uVar2;
      local_1238._0_4_ = uVar2;
      local_1238._8_4_ = uVar2;
      local_1238._12_4_ = uVar2;
      local_1238._16_4_ = uVar2;
      local_1238._20_4_ = uVar2;
      local_1238._24_4_ = uVar2;
      local_1238._28_4_ = uVar2;
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1258._4_4_ = uVar2;
      local_1258._0_4_ = uVar2;
      local_1258._8_4_ = uVar2;
      local_1258._12_4_ = uVar2;
      local_1258._16_4_ = uVar2;
      local_1258._20_4_ = uVar2;
      local_1258._24_4_ = uVar2;
      local_1258._28_4_ = uVar2;
      auVar22._0_4_ = fVar24 + fVar24 * auVar25._0_4_;
      auVar22._4_4_ = fVar27 + fVar27 * auVar25._4_4_;
      auVar22._8_4_ = fVar28 + fVar28 * auVar25._8_4_;
      auVar22._12_4_ = fVar29 + fVar29 * auVar25._12_4_;
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1278._4_4_ = uVar2;
      local_1278._0_4_ = uVar2;
      local_1278._8_4_ = uVar2;
      local_1278._12_4_ = uVar2;
      local_1278._16_4_ = uVar2;
      local_1278._20_4_ = uVar2;
      local_1278._24_4_ = uVar2;
      local_1278._28_4_ = uVar2;
      auVar25 = vshufps_avx(auVar22,auVar22,0);
      local_1298._16_16_ = auVar25;
      local_1298._0_16_ = auVar25;
      auVar25 = vmovshdup_avx(auVar22);
      auVar30 = vshufps_avx(auVar22,auVar22,0x55);
      local_12b8._16_16_ = auVar30;
      local_12b8._0_16_ = auVar30;
      auVar30 = vshufpd_avx(auVar22,auVar22,1);
      auVar21 = vshufps_avx(auVar22,auVar22,0xaa);
      uVar19 = (ulong)(auVar22._0_4_ < 0.0) * 0x20;
      auVar26 = ZEXT3264(local_1258);
      auVar34 = ZEXT3264(local_12b8);
      uVar20 = (ulong)(auVar25._0_4_ < 0.0) << 5 | 0x40;
      auVar32 = ZEXT3264(local_1278);
      local_12d8._16_16_ = auVar21;
      local_12d8._0_16_ = auVar21;
      auVar35 = ZEXT3264(local_12d8);
      auVar23 = ZEXT3264(local_1238);
      auVar33 = ZEXT3264(local_1298);
      uVar18 = (ulong)(auVar30._0_4_ < 0.0) << 5 | 0x80;
      auVar25 = vshufps_avx(auVar5,auVar5,0);
      local_11f8._16_16_ = auVar25;
      local_11f8._0_16_ = auVar25;
      auVar36 = ZEXT3264(local_11f8);
      auVar25 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      local_1218._16_16_ = auVar25;
      local_1218._0_16_ = auVar25;
      auVar37 = ZEXT3264(local_1218);
      local_12f8 = ray;
      local_12f0 = context;
LAB_00e7d890:
      if (local_1300 != local_11d8) {
        uVar16 = local_1300[-1];
        local_1300 = local_1300 + -1;
        while ((uVar16 & 8) == 0) {
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar19),auVar23._0_32_);
          auVar7._4_4_ = auVar33._4_4_ * auVar6._4_4_;
          auVar7._0_4_ = auVar33._0_4_ * auVar6._0_4_;
          auVar7._8_4_ = auVar33._8_4_ * auVar6._8_4_;
          auVar7._12_4_ = auVar33._12_4_ * auVar6._12_4_;
          auVar7._16_4_ = auVar33._16_4_ * auVar6._16_4_;
          auVar7._20_4_ = auVar33._20_4_ * auVar6._20_4_;
          auVar7._24_4_ = auVar33._24_4_ * auVar6._24_4_;
          auVar7._28_4_ = auVar6._28_4_;
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar20),auVar26._0_32_);
          auVar8._4_4_ = auVar34._4_4_ * auVar6._4_4_;
          auVar8._0_4_ = auVar34._0_4_ * auVar6._0_4_;
          auVar8._8_4_ = auVar34._8_4_ * auVar6._8_4_;
          auVar8._12_4_ = auVar34._12_4_ * auVar6._12_4_;
          auVar8._16_4_ = auVar34._16_4_ * auVar6._16_4_;
          auVar8._20_4_ = auVar34._20_4_ * auVar6._20_4_;
          auVar8._24_4_ = auVar34._24_4_ * auVar6._24_4_;
          auVar8._28_4_ = auVar6._28_4_;
          auVar6 = vmaxps_avx(auVar7,auVar8);
          auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar18),auVar32._0_32_);
          auVar9._4_4_ = auVar35._4_4_ * auVar7._4_4_;
          auVar9._0_4_ = auVar35._0_4_ * auVar7._0_4_;
          auVar9._8_4_ = auVar35._8_4_ * auVar7._8_4_;
          auVar9._12_4_ = auVar35._12_4_ * auVar7._12_4_;
          auVar9._16_4_ = auVar35._16_4_ * auVar7._16_4_;
          auVar9._20_4_ = auVar35._20_4_ * auVar7._20_4_;
          auVar9._24_4_ = auVar35._24_4_ * auVar7._24_4_;
          auVar9._28_4_ = auVar7._28_4_;
          auVar7 = vmaxps_avx(auVar9,auVar36._0_32_);
          auVar6 = vmaxps_avx(auVar6,auVar7);
          auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar19 ^ 0x20)),auVar23._0_32_
                             );
          auVar10._4_4_ = auVar33._4_4_ * auVar7._4_4_;
          auVar10._0_4_ = auVar33._0_4_ * auVar7._0_4_;
          auVar10._8_4_ = auVar33._8_4_ * auVar7._8_4_;
          auVar10._12_4_ = auVar33._12_4_ * auVar7._12_4_;
          auVar10._16_4_ = auVar33._16_4_ * auVar7._16_4_;
          auVar10._20_4_ = auVar33._20_4_ * auVar7._20_4_;
          auVar10._24_4_ = auVar33._24_4_ * auVar7._24_4_;
          auVar10._28_4_ = auVar7._28_4_;
          auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar20 ^ 0x20)),auVar26._0_32_
                             );
          auVar11._4_4_ = auVar34._4_4_ * auVar7._4_4_;
          auVar11._0_4_ = auVar34._0_4_ * auVar7._0_4_;
          auVar11._8_4_ = auVar34._8_4_ * auVar7._8_4_;
          auVar11._12_4_ = auVar34._12_4_ * auVar7._12_4_;
          auVar11._16_4_ = auVar34._16_4_ * auVar7._16_4_;
          auVar11._20_4_ = auVar34._20_4_ * auVar7._20_4_;
          auVar11._24_4_ = auVar34._24_4_ * auVar7._24_4_;
          auVar11._28_4_ = auVar7._28_4_;
          auVar7 = vminps_avx(auVar10,auVar11);
          auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar18 ^ 0x20)),auVar32._0_32_
                             );
          auVar12._4_4_ = auVar35._4_4_ * auVar8._4_4_;
          auVar12._0_4_ = auVar35._0_4_ * auVar8._0_4_;
          auVar12._8_4_ = auVar35._8_4_ * auVar8._8_4_;
          auVar12._12_4_ = auVar35._12_4_ * auVar8._12_4_;
          auVar12._16_4_ = auVar35._16_4_ * auVar8._16_4_;
          auVar12._20_4_ = auVar35._20_4_ * auVar8._20_4_;
          auVar12._24_4_ = auVar35._24_4_ * auVar8._24_4_;
          auVar12._28_4_ = auVar8._28_4_;
          auVar8 = vminps_avx(auVar12,auVar37._0_32_);
          auVar7 = vminps_avx(auVar7,auVar8);
          auVar6 = vcmpps_avx(auVar6,auVar7,2);
          uVar14 = vmovmskps_avx(auVar6);
          if (uVar14 == 0) goto LAB_00e7d890;
          uVar14 = uVar14 & 0xff;
          uVar15 = uVar16 & 0xfffffffffffffff0;
          lVar4 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar16 = *(ulong *)(uVar15 + lVar4 * 8);
          uVar14 = uVar14 - 1 & uVar14;
          uVar17 = (ulong)uVar14;
          if (uVar14 != 0) {
            do {
              *local_1300 = uVar16;
              local_1300 = local_1300 + 1;
              lVar4 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              uVar16 = *(ulong *)(uVar15 + lVar4 * 8);
              uVar17 = uVar17 - 1 & uVar17;
            } while (uVar17 != 0);
          }
        }
        local_12e8 = (Primitive *)(uVar16 & 0xfffffffffffffff0);
        local_12e0 = (ulong)((uint)uVar16 & 0xf) - 7;
        while( true ) {
          local_12e0 = local_12e0 + -1;
          if (local_12e0 == 0) break;
          prim = local_12e8;
          local_12e8 = local_12e8 + 1;
          bVar13 = InstanceArrayIntersector1::occluded(&local_1301,ray,local_12f0,prim);
          auVar37 = ZEXT3264(local_1218);
          auVar36 = ZEXT3264(local_11f8);
          ray = local_12f8;
          if (bVar13) {
            local_12f8->tfar = -INFINITY;
            return;
          }
        }
        auVar23 = ZEXT3264(local_1238);
        auVar26 = ZEXT3264(local_1258);
        auVar32 = ZEXT3264(local_1278);
        auVar33 = ZEXT3264(local_1298);
        auVar34 = ZEXT3264(local_12b8);
        auVar35 = ZEXT3264(local_12d8);
        goto LAB_00e7d890;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }